

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

void __thiscall Annotator_assignUnitsId_Test::TestBody(Annotator_assignUnitsId_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  UnitsPtr units;
  ModelPtr model;
  AnnotatorPtr annotator;
  ParserPtr parser;
  AssertHelper aAStack_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  internal local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined1 local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  shared_ptr *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined1 local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  long *local_30 [2];
  long local_20 [2];
  
  libcellml::Annotator::create();
  libcellml::Parser::create(SUB81(local_40,0));
  libcellml::Parser::parseModel(local_60);
  libcellml::Model::units((ulong)local_70);
  libcellml::Annotator::setModel(local_50);
  libcellml::Entity::id_abi_cxx11_();
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            (local_80,"\"\"","units->id()",(char (*) [1])0x166c1a,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_78.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x52a,pcVar2);
    testing::internal::AssertHelper::operator=(aAStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(aAStack_a8);
    if ((long *)local_a0._M_dataplus._M_p != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)local_a0._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_a0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_80,"\"b4da55\"","units->id()",(char (*) [7])"b4da55",&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x52d,pcVar2);
    testing::internal::AssertHelper::operator=(aAStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(aAStack_a8);
    if ((long *)local_a0._M_dataplus._M_p != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)local_a0._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_a0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

TEST(Annotator, assignUnitsId)
{
    auto annotator = libcellml::Annotator::create();
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringNoIds);

    auto units = model->units(0);

    annotator->setModel(model);

    EXPECT_EQ("", units->id());

    annotator->assignId(units);
    EXPECT_EQ("b4da55", units->id());
}